

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytrieinp.c
# Opt level: O1

tommy_trie_inplace_node *
tommy_trie_inplace_bucket(tommy_trie_inplace *trie_inplace,tommy_key_t key)

{
  byte bVar1;
  tommy_trie_inplace_node *ptVar2;
  byte bVar3;
  long in_FS_OFFSET;
  
  ptVar2 = trie_inplace->bucket[key >> 0x1a];
  if (ptVar2 != (tommy_trie_inplace_node *)0x0) {
    bVar3 = 0x1a;
    do {
      if (ptVar2->key == key) break;
      bVar1 = bVar3 & 0x1f;
      bVar3 = bVar3 - 2;
      ptVar2 = ptVar2->map[key >> bVar1 & 3];
    } while (ptVar2 != (tommy_trie_inplace_node_struct *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return ptVar2;
  }
  __stack_chk_fail();
}

Assistant:

tommy_trie_inplace_node* tommy_trie_inplace_bucket(tommy_trie_inplace* trie_inplace, tommy_key_t key)
{
	tommy_trie_inplace_node* node;
	tommy_uint_t shift;

	node = trie_inplace->bucket[key >> TOMMY_TRIE_INPLACE_BUCKET_SHIFT];
	shift = TOMMY_TRIE_INPLACE_BUCKET_SHIFT;

	while (node && node->key != key) {
		node = node->map[(key >> shift) & TOMMY_TRIE_INPLACE_TREE_MASK];
		shift -= TOMMY_TRIE_INPLACE_TREE_BIT;
	}

	return node;
}